

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::penChanged(QRasterPaintEngine *this)

{
  QRasterPaintEngineState *pQVar1;
  QRasterPaintEngineState *s;
  
  pQVar1 = state((QRasterPaintEngine *)0x5619f7);
  pQVar1->strokeFlags = pQVar1->strokeFlags | 1;
  pQVar1->dirty = pQVar1->dirty | 1;
  return;
}

Assistant:

void QRasterPaintEngine::penChanged()
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::penChanged():" << state()->pen;
#endif
    QRasterPaintEngineState *s = state();
    Q_ASSERT(s);
    s->strokeFlags |= DirtyPen;
    s->dirty |= DirtyPen;
}